

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O3

double duration(int64_t s,int64_t e)

{
  return (double)(e - s) / 1000000.0;
}

Assistant:

double duration(int64_t s, int64_t e)
{
#if OQPI_PLATFORM_WIN
    static const auto F = query_performance_frequency();
    auto dt             = e - s;
    return (dt / (F * 1.0)) * 1000.0;

#elif OQPI_PLATFORM_POSIX
    auto dt = e - s;
    return dt / 1e6;

#endif
}